

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wireframe.cpp
# Opt level: O1

void line(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t y;
  int iVar5;
  int iVar6;
  size_t x;
  int iVar7;
  int iVar8;
  size_t sVar9;
  TGAColor local_50;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  TGAImage *local_38;
  
  local_50.bgra = color.bgra;
  uVar2 = x0 - x1;
  local_3c = -uVar2;
  if (0 < (int)uVar2) {
    local_3c = uVar2;
  }
  local_50.bytespp = color.bytespp;
  uVar2 = y0 - y1;
  local_40 = -uVar2;
  if (0 < (int)uVar2) {
    local_40 = uVar2;
  }
  iVar6 = x1;
  iVar8 = y0;
  if (local_3c < local_40) {
    iVar6 = y1;
    iVar8 = x0;
    y1 = x1;
    x0 = y0;
  }
  iVar7 = y1;
  iVar5 = iVar6;
  iVar3 = x0;
  if (iVar6 < x0) {
    iVar7 = iVar8;
    iVar5 = x0;
    iVar3 = iVar6;
    iVar8 = y1;
  }
  iVar4 = iVar7 - iVar8;
  iVar1 = -iVar4;
  if (0 < iVar4) {
    iVar1 = iVar4;
  }
  iVar4 = iVar5 - iVar3;
  if (iVar3 <= iVar5) {
    local_44 = ((iVar8 < iVar7) - 1) + (uint)(iVar8 < iVar7);
    local_48 = iVar4 * 2;
    if (iVar6 < x0) {
      x0 = iVar6;
    }
    sVar9 = (size_t)x0;
    iVar6 = (iVar5 - x0) + 1;
    iVar7 = 0;
    local_38 = image;
    do {
      y = (long)iVar8;
      x = sVar9;
      if (local_3c < local_40) {
        y = sVar9;
        x = (long)iVar8;
      }
      TGAImage::set(local_38,x,y,&local_50);
      iVar7 = iVar7 + iVar1 * 2;
      iVar5 = 0;
      if (iVar4 < iVar7) {
        iVar5 = local_48;
      }
      iVar3 = 0;
      if (iVar4 < iVar7) {
        iVar3 = local_44;
      }
      iVar7 = iVar7 - iVar5;
      iVar8 = iVar8 + iVar3;
      sVar9 = sVar9 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

void line(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    bool steep = false;
    if (std::abs(x0 - x1) < std::abs(y0 - y1)) {
        std::swap(x0, y0);
        std::swap(x1, y1);
        steep = true;
    }
    if (x0 > x1) {
        std::swap(x0, x1);
        std::swap(y0, y1);
    }
    int dx = x1 - x0;
    int dy = y1 - y0;
    int derror2 = std::abs(dy) * 2;
    int error2 = 0;
    int y = y0;
    for (int x = x0; x <= x1; x++) {
        if (steep) {
            image.set(y, x, color);
        } else {
            image.set(x, y, color);
        }
        error2 += derror2;
        if (error2 > dx) {
            y += (y1 > y0 ? 1 : -1);
            error2 -= dx * 2;
        }
    }
}